

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  char *extraout_RAX;
  ulong uVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  RepeatedField<unsigned_long> *this;
  char *pcVar7;
  char *pcVar8;
  uint *puVar9;
  byte *p;
  uint res;
  char *unaff_R15;
  pair<const_char_*,_unsigned_int> pVar10;
  
  puVar9 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar9 & 3) != 0) {
LAB_00452381:
    AlignFail();
  }
  this = (RepeatedField<unsigned_long> *)((long)&msg->_vptr_MessageLite + (ulong)*puVar9);
  aVar6 = data.field_0;
  ctx_00 = ctx;
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  do {
    pcVar7 = (char *)(long)*ptr;
    if ((long)pcVar7 < 0) {
      uVar5 = (long)(char)((byte *)ptr)[1] << 7 | 0x7f;
      if ((long)uVar5 < 0) {
        aVar6.data = (long)(char)((byte *)ptr)[2] << 0xe | 0x3fff;
        if ((long)aVar6 < 0) {
          ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[3] << 0x15 | 0x1fffff);
          uVar5 = uVar5 & (ulong)ctx_00;
          if ((long)uVar5 < 0) {
            ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[4] << 0x1c | 0xfffffff);
            aVar6.data = aVar6.data & (ulong)ctx_00;
            if ((long)aVar6.data < 0) {
              ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[5] << 0x23 | 0x7ffffffff);
              uVar5 = uVar5 & (ulong)ctx_00;
              if ((long)uVar5 < 0) {
                ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[6] << 0x2a | 0x3ffffffffff);
                aVar6.data = aVar6.data & (ulong)ctx_00;
                if ((long)aVar6 < 0) {
                  ctx_00 = (ParseContext *)((long)(char)((byte *)ptr)[7] << 0x31 | 0x1ffffffffffff);
                  uVar5 = uVar5 & (ulong)ctx_00;
                  if ((long)uVar5 < 0) {
                    ctx_00 = (ParseContext *)((ulong)((byte *)ptr)[8] << 0x38 | 0xffffffffffffff);
                    aVar6.data = aVar6.data & (ulong)ctx_00;
                    if ((long)aVar6 < 0) {
                      p = (byte *)ptr + 10;
                      if (((byte *)ptr)[9] != 1) {
                        bVar1 = ((byte *)ptr)[9];
                        ctx_00 = (ParseContext *)CONCAT71((int7)((ulong)ctx_00 >> 8),bVar1);
                        if ((char)bVar1 < '\0') {
                          p = (byte *)0x0;
                          goto LAB_004521ac;
                        }
                        if ((bVar1 & 1) == 0) {
                          aVar6.data = aVar6.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      p = (byte *)ptr + 9;
                    }
                  }
                  else {
                    p = (byte *)ptr + 8;
                  }
                }
                else {
                  p = (byte *)ptr + 7;
                }
              }
              else {
                p = (byte *)ptr + 6;
              }
            }
            else {
              p = (byte *)ptr + 5;
            }
          }
          else {
            p = (byte *)ptr + 4;
          }
        }
        else {
          p = (byte *)ptr + 3;
        }
        uVar5 = uVar5 & aVar6.data;
      }
      else {
        p = (byte *)ptr + 2;
      }
      pcVar7 = (char *)((ulong)pcVar7 & uVar5);
    }
    else {
      p = (byte *)ptr + 1;
    }
LAB_004521ac:
    if (p == (byte *)0x0) {
      iVar4 = 4;
    }
    else {
      pcVar7 = (char *)(-(ulong)((uint)pcVar7 & 1) ^ (ulong)pcVar7 >> 1);
      RepeatedField<unsigned_long>::Add(this,(unsigned_long)pcVar7);
      pVar10._8_8_ = extraout_RDX;
      pVar10.first = extraout_RAX;
      if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
        bVar1 = *p;
        ptr = (char *)(p + 1);
        unaff_R15 = (char *)(ulong)bVar1;
        if ((char)bVar1 < '\0') {
          bVar2 = *ptr;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = extraout_RDX;
          pVar10 = (pair<const_char_*,_unsigned_int>)(auVar3 << 0x40);
          aVar6.data = (ulong)bVar2 << 7;
          res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          pcVar8 = (char *)(ulong)res;
          if ((char)bVar2 < '\0') {
            pVar10 = ReadTagFallback((char *)p,res);
            ptr = pVar10.first;
            unaff_R15 = (char *)(ulong)pVar10.second;
            pcVar7 = pcVar8;
          }
          else {
            ptr = (char *)(p + 2);
            unaff_R15 = pcVar8;
          }
        }
        ctx_00 = pVar10._8_8_;
        iVar4 = (uint)((byte *)ptr == (byte *)0x0) << 2;
      }
      else {
        iVar4 = 5;
        ctx_00 = extraout_RDX;
      }
    }
    if (iVar4 != 0) {
      if (iVar4 == 4) {
        pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar6,table,hasbits);
        return pcVar7;
      }
      break;
    }
  } while ((int)unaff_R15 == data.field_0._0_4_);
  if ((ulong)table->has_bits_offset != 0) {
    puVar9 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar9 & 3) != 0) goto LAB_00452381;
    *puVar9 = *puVar9 | (uint)hasbits;
  }
  return (char *)p;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}